

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O1

bool __thiscall sf::Font::loadFromStream(Font *this,InputStream *stream)

{
  char *__s;
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  size_t sVar6;
  FT_Face_conflict face;
  FT_Stroker stroker;
  FT_Library library;
  FT_Open_Args args;
  void *local_98;
  void *local_90;
  void *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  undefined4 local_60 [8];
  undefined8 *local_40;
  undefined8 local_38;
  
  cleanup(this,(EVP_PKEY_CTX *)stream);
  piVar2 = (int *)operator_new(4);
  *piVar2 = 1;
  this->m_refCount = piVar2;
  iVar1 = FT_Init_FreeType(&local_88);
  if (iVar1 == 0) {
    this->m_library = local_88;
    (**(code **)(*(long *)stream + 0x18))(stream,0);
    puVar4 = (undefined8 *)operator_new(0x50);
    *puVar4 = 0;
    puVar4[1] = 0;
    puVar4[2] = 0;
    puVar4[3] = 0;
    puVar4[4] = 0;
    puVar4[5] = 0;
    puVar4[6] = 0;
    puVar4[7] = 0;
    puVar4[8] = 0;
    puVar4[9] = 0;
    uVar5 = (**(code **)(*(long *)stream + 0x28))(stream);
    puVar4[1] = uVar5;
    puVar4[2] = 0;
    puVar4[3] = stream;
    puVar4[5] = anon_unknown.dwarf_1994c0::read;
    puVar4[6] = anon_unknown.dwarf_1994c0::close;
    local_60[0] = 2;
    local_38 = 0;
    local_40 = puVar4;
    iVar1 = FT_Open_Face(this->m_library,local_60,0,&local_98);
    if (iVar1 == 0) {
      iVar1 = FT_Stroker_New(this->m_library,&local_90);
      if (iVar1 == 0) {
        iVar1 = FT_Select_Charmap(local_98,0x756e6963);
        if (iVar1 == 0) {
          this->m_stroker = local_90;
          this->m_face = local_98;
          this->m_streamRec = puVar4;
          __s = *(char **)((long)local_98 + 0x28);
          local_80 = local_70;
          if (__s == (char *)0x0) {
            local_78 = 0;
            local_70[0] = 0;
          }
          else {
            sVar6 = strlen(__s);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + sVar6);
          }
          std::__cxx11::string::operator=((string *)&this->m_info,(string *)&local_80);
          if (local_80 != local_70) {
            operator_delete(local_80);
          }
          return true;
        }
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,
                   "Failed to load font from stream (failed to set the Unicode character set)",0x49)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        FT_Done_Face(local_98);
        FT_Stroker_Done(local_90);
      }
      else {
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Failed to load font from stream (failed to create the stroker)",0x3e);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        FT_Done_Face(local_98);
      }
    }
    else {
      poVar3 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Failed to load font from stream (failed to create the font face)",0x40);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    operator_delete(puVar4);
  }
  else {
    poVar3 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Failed to load font from stream (failed to initialize FreeType)",0x3f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool Font::loadFromStream(InputStream& stream)
{
    // Cleanup the previous resources
    cleanup();
    m_refCount = new int(1);

    // Initialize FreeType
    // Note: we initialize FreeType for every font instance in order to avoid having a single
    // global manager that would create a lot of issues regarding creation and destruction order.
    FT_Library library;
    if (FT_Init_FreeType(&library) != 0)
    {
        err() << "Failed to load font from stream (failed to initialize FreeType)" << std::endl;
        return false;
    }
    m_library = library;

    // Make sure that the stream's reading position is at the beginning
    stream.seek(0);

    // Prepare a wrapper for our stream, that we'll pass to FreeType callbacks
    FT_StreamRec* rec = new FT_StreamRec;
    std::memset(rec, 0, sizeof(*rec));
    rec->base               = NULL;
    rec->size               = static_cast<unsigned long>(stream.getSize());
    rec->pos                = 0;
    rec->descriptor.pointer = &stream;
    rec->read               = &read;
    rec->close              = &close;

    // Setup the FreeType callbacks that will read our stream
    FT_Open_Args args;
    args.flags  = FT_OPEN_STREAM;
    args.stream = rec;
    args.driver = 0;

    // Load the new font face from the specified stream
    FT_Face face;
    if (FT_Open_Face(static_cast<FT_Library>(m_library), &args, 0, &face) != 0)
    {
        err() << "Failed to load font from stream (failed to create the font face)" << std::endl;
        delete rec;
        return false;
    }

    // Load the stroker that will be used to outline the font
    FT_Stroker stroker;
    if (FT_Stroker_New(static_cast<FT_Library>(m_library), &stroker) != 0)
    {
        err() << "Failed to load font from stream (failed to create the stroker)" << std::endl;
        FT_Done_Face(face);
        delete rec;
        return false;
    }

    // Select the Unicode character map
    if (FT_Select_Charmap(face, FT_ENCODING_UNICODE) != 0)
    {
        err() << "Failed to load font from stream (failed to set the Unicode character set)" << std::endl;
        FT_Done_Face(face);
        FT_Stroker_Done(stroker);
        delete rec;
        return false;
    }

    // Store the loaded font in our ugly void* :)
    m_stroker = stroker;
    m_face = face;
    m_streamRec = rec;

    // Store the font information
    m_info.family = face->family_name ? face->family_name : std::string();

    return true;
}